

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParser::applyAttributes(QTextHtmlParser *this,QStringList *attributes)

{
  QTextCharFormat *this_00;
  QTextBlockFormat *this_01;
  QTextLength *pQVar1;
  int *destination;
  int *destination_00;
  QTextHTMLElements QVar2;
  QTextHtmlParserNode *this_02;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  long lVar5;
  int iVar6;
  QColor *pQVar7;
  QStringView QVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  QArrayData *pQVar11;
  bool bVar12;
  char cVar13;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  QString *data;
  iterator iVar17;
  ulong uVar18;
  long lVar19;
  qsizetype qVar20;
  bool bVar21;
  size_t sVar22;
  undefined8 *puVar23;
  QString *pQVar24;
  QTextLength *pQVar25;
  QTextFormat *pQVar26;
  int *piVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  qreal qVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QLatin1String QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QStringView QVar57;
  QStringView QVar58;
  QStringView QVar59;
  QStringView QVar60;
  QStringView QVar61;
  QStringView QVar62;
  QStringView QVar63;
  QStringView QVar64;
  QStringView QVar65;
  QStringView QVar66;
  QStringView QVar67;
  QStringView QVar68;
  QStringView QVar69;
  QStringView QVar70;
  QStringView QVar71;
  QStringView QVar72;
  QStringView QVar73;
  QStringView QVar74;
  QStringView QVar75;
  QStringView QVar76;
  QStringView QVar77;
  QStringView QVar78;
  QStringView QVar79;
  QStringView QVar80;
  QStringView QVar81;
  QStringView QVar82;
  QStringView QVar83;
  QStringView QVar84;
  QStringView QVar85;
  QStringView QVar86;
  QStringView QVar87;
  QStringView QVar88;
  QStringView QVar89;
  QStringView QVar90;
  QStringView QVar91;
  QStringView QVar92;
  QStringView QVar93;
  QStringView QVar94;
  QStringView QVar95;
  QStringView QVar96;
  QStringView QVar97;
  QColor QVar98;
  undefined1 auVar99 [16];
  QLatin1String QVar100;
  QLatin1String QVar101;
  QLatin1String QVar102;
  QLatin1String QVar103;
  QLatin1String QVar104;
  QLatin1String QVar105;
  QLatin1String QVar106;
  QLatin1String QVar107;
  QLatin1String QVar108;
  QLatin1String QVar109;
  QLatin1String QVar110;
  QLatin1String QVar111;
  QLatin1String QVar112;
  QLatin1String QVar113;
  QLatin1String QVar114;
  QLatin1String QVar115;
  QLatin1String QVar116;
  QLatin1String QVar117;
  QLatin1String QVar118;
  QLatin1String QVar119;
  QLatin1String QVar120;
  QLatin1String QVar121;
  QLatin1String QVar122;
  QLatin1String QVar123;
  QLatin1String QVar124;
  QLatin1String QVar125;
  QLatin1String QVar126;
  QLatin1String QVar127;
  QLatin1String QVar128;
  QLatin1String QVar129;
  QLatin1String QVar130;
  QLatin1String QVar131;
  QLatin1String QVar132;
  QLatin1String QVar133;
  QLatin1String QVar134;
  QLatin1String QVar135;
  QLatin1String QVar136;
  QLatin1String QVar137;
  QLatin1String QVar138;
  QLatin1String QVar139;
  QLatin1String QVar140;
  QLatin1String QVar141;
  QLatin1String QVar142;
  QLatin1String QVar143;
  QLatin1String QVar144;
  QLatin1String QVar145;
  QLatin1String QVar146;
  QLatin1String QVar147;
  QLatin1String QVar148;
  QLatin1String QVar149;
  QLatin1String QVar150;
  QLatin1String QVar151;
  QLatin1String QVar152;
  QLatin1String QVar153;
  QLatin1String QVar154;
  QLatin1String QVar155;
  QLatin1String QVar156;
  QLatin1String QVar157;
  QLatin1String QVar158;
  QLatin1String QVar159;
  QLatin1String QVar160;
  QLatin1String QVar161;
  QLatin1String QVar162;
  QLatin1String QVar163;
  QLatin1String QVar164;
  QLatin1String QVar165;
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView name_01;
  QColor color;
  QAnyStringView name_02;
  iterator __begin6;
  QString local_130;
  QString local_118;
  QString local_f8;
  QString local_d8;
  QStringTokenizerBase<QStringView,_QChar> local_b8;
  QArrayDataPointer<QString> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  char *pcStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (storage_type_conflict *)0x0;
  local_f8.d.size = 0;
  if (((attributes->d).size & 1) == 0) {
    iVar17 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
    if ((attributes->d).size != 0) {
      this_02 = iVar17.i[-1];
      this_01 = &this_02->blockFormat;
      pQVar1 = &this_02->width;
      this_00 = &this_02->charFormat;
      destination = &this_02->tableCellColSpan;
      destination_00 = &this_02->tableCellRowSpan;
      uVar28 = 0;
      bVar21 = false;
      do {
        pQVar24 = (attributes->d).ptr;
        pQVar3 = &(pQVar24[uVar28].d.d)->super_QArrayData;
        pcVar4 = pQVar24[uVar28].d.ptr;
        lVar5 = pQVar24[uVar28].d.size;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uVar18 = uVar28 | 1;
        pQVar24 = (attributes->d).ptr;
        local_118.d.d = pQVar24[uVar18].d.d;
        local_118.d.ptr = pQVar24[uVar18].d.ptr;
        local_118.d.size = pQVar24[uVar18].d.size;
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar2 = this_02->id;
        pQVar25 = pQVar1;
        if (QVar2 < Html_table) {
          switch(QVar2) {
          case Html_font:
            if (lVar5 == 4) {
              QVar48.m_data = pcVar4;
              QVar48.m_size = 4;
              QVar117.m_data = "size";
              QVar117.m_size = 4;
              cVar13 = QtPrivate::equalStrings(QVar48,QVar117);
              if ((cVar13 == '\0') || ((undefined8 *)local_118.d.size == (undefined8 *)0x0)) {
                QVar59.m_data = pcVar4;
                QVar59.m_size = 4;
                QVar127.m_data = "face";
                QVar127.m_size = 4;
                cVar13 = QtPrivate::equalStrings(QVar59,QVar127);
                if (cVar13 == '\0') goto LAB_0051e397;
                local_78._0_4_ = (undefined4)local_118.d.size;
                local_78._4_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
                local_78._8_4_ = SUB84(local_118.d.ptr,0);
                local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
                qVar20 = QStringView::indexOf((QStringView *)&local_78,(QChar)0x2c,0,CaseSensitive);
                if (qVar20 == -1) {
                  local_b8.super_QStringTokenizerBaseBase.m_sb.
                  super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
                  local_b8.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
                  local_b8.m_haystack.m_size = 0;
                  local_b8.m_haystack.m_data = (storage_type_conflict *)0x0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_b8,0,&local_118);
                  QList<QString>::end((QList<QString> *)&local_b8);
                  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x1fe7,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                }
                else {
                  local_98.d = (Data *)0x0;
                  local_98.ptr = (QString *)0x0;
                  local_98.size = 0;
                  local_b8.super_QStringTokenizerBaseBase.m_sb.
                  super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
                  local_b8.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
                  local_b8.m_haystack.m_size = local_118.d.size;
                  local_b8.m_haystack.m_data = local_118.d.ptr;
                  local_b8.m_needle.ucs = L',';
                  local_48 = &DAT_aaaaaaaaaaaaaaaa;
                  local_58 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                  local_78._16_4_ = 0xaaaaaaaa;
                  local_78._20_4_ = 0xaaaaaaaa;
                  pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
                  local_78._0_4_ = 0xaaaaaaaa;
                  local_78._4_4_ = 0xaaaaaaaa;
                  local_78._8_4_ = 0xaaaaaaaa;
                  local_78._12_4_ = 0xaaaaaaaa;
                  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
                            ((iterator *)&local_78,&local_b8);
                  if ((char)pcStack_60 == '\x01') {
                    do {
                      QVar8.m_size._4_4_ = local_78._12_4_;
                      QVar8.m_size._0_4_ = local_78._8_4_;
                      QVar8.m_data._0_4_ = local_78._16_4_;
                      QVar8.m_data._4_4_ = local_78._20_4_;
                      auVar99 = QtPrivate::trimmed(QVar8);
                      QString::QString(&local_130,auVar99._8_8_,auVar99._0_8_);
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_130);
                      QList<QString>::end((QList<QString> *)&local_98);
                      if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_130.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_130.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      QStringTokenizerBase<QStringView,_QChar>::iterator::advance
                                ((iterator *)&local_78);
                    } while ((char)pcStack_60 != '\0');
                  }
                  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_98);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x1fe7,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
                }
              }
              else {
                QVar49.m_data = local_118.d.ptr;
                QVar49.m_size = local_118.d.size;
                lVar19 = QString::toIntegral_helper(QVar49,(bool *)0x0,10);
                iVar15 = (int)lVar19;
                if (iVar15 != lVar19) {
                  iVar15 = 0;
                }
                iVar6 = iVar15 + -3;
                if (((char16_t)*(Spec *)local_118.d.ptr + L'ￕ' & 0xfffdU) == 0) {
                  iVar6 = iVar15;
                }
                ::QVariant::QVariant((QVariant *)&local_78,iVar6);
                iVar15 = 0x2002;
LAB_0051ddf7:
                QTextFormat::setProperty(&this_00->super_QTextFormat,iVar15,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
              }
            }
            else {
LAB_0051e397:
              if ((lVar5 == 5) &&
                 (QVar60.m_data = pcVar4, QVar60.m_size = 5, QVar128.m_data = "color",
                 QVar128.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar60,QVar128),
                 cVar13 != '\0')) {
                local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                name_02.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
                name_02.m_size = extraout_RDX_03;
                QVar98 = QColor::fromString((QColor *)local_118.d.ptr,name_02);
                local_98.d = QVar98._0_8_;
                local_98.ptr._0_6_ = QVar98.ct._4_6_;
                if (QVar98.cspec == Invalid) {
                  local_78._0_4_ = 2;
                  local_78._4_4_ = 0;
                  local_78._8_4_ = 0;
                  local_78._12_4_ = 0;
                  local_78._16_4_ = 0;
                  local_78._20_4_ = 0;
                  pcStack_60 = "default";
                  QString::toLatin1_helper((QString *)&local_b8);
                  puVar23 = (undefined8 *)local_b8.m_haystack.m_size;
                  if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                    puVar23 = &QByteArray::_empty;
                  }
                  QMessageLogger::warning
                            ((char *)local_78.data,
                             "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar23);
                  if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_b8.super_QStringTokenizerBaseBase =
                         *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                    UNLOCK();
                    if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                    }
                  }
                }
                QBrush::QBrush((QBrush *)&local_b8,(QColor *)&local_98,SolidPattern);
                QBrush::operator_cast_to_QVariant((QVariant *)&local_78,(QBrush *)&local_b8);
                iVar15 = 0x821;
LAB_0051e452:
                QTextFormat::setProperty(&this_00->super_QTextFormat,iVar15,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                QBrush::~QBrush((QBrush *)&local_b8);
              }
            }
            break;
          case Html_ul:
          case Html_ol:
            if (lVar5 == 5) {
              QVar61.m_data = pcVar4;
              QVar61.m_size = 5;
              QVar129.m_data = "start";
              QVar129.m_size = 5;
              cVar13 = QtPrivate::equalStrings(QVar61,QVar129);
              if (cVar13 != '\0') {
                setIntAttribute(&this_02->listStart,&local_118);
              }
            }
            else if ((lVar5 == 4) &&
                    (QVar30.m_data = pcVar4, QVar30.m_size = 4, QVar100.m_data = "type",
                    QVar100.m_size = 4, cVar13 = QtPrivate::equalStrings(QVar30,QVar100),
                    cVar13 != '\0')) {
              this_02->field_0x90 = this_02->field_0x90 | 4;
              if ((undefined8 *)local_118.d.size == (undefined8 *)0x1) {
                QVar31.m_data = local_118.d.ptr;
                QVar31.m_size = 1;
                QVar101.m_data = "1";
                QVar101.m_size = 1;
                cVar13 = QtPrivate::equalStrings(QVar31,QVar101);
                if (cVar13 == '\0') {
                  QVar71.m_data = local_118.d.ptr;
                  QVar71.m_size = 1;
                  QVar139.m_data = "a";
                  QVar139.m_size = 1;
                  cVar13 = QtPrivate::equalStrings(QVar71,QVar139);
                  if (cVar13 == '\0') {
                    QVar73.m_data = local_118.d.ptr;
                    QVar73.m_size = 1;
                    QVar141.m_data = "A";
                    QVar141.m_size = 1;
                    cVar13 = QtPrivate::equalStrings(QVar73,QVar141);
                    if (cVar13 == '\0') {
                      QVar74.m_data = local_118.d.ptr;
                      QVar74.m_size = 1;
                      QVar142.m_data = "i";
                      QVar142.m_size = 1;
                      cVar13 = QtPrivate::equalStrings(QVar74,QVar142);
                      if (cVar13 == '\0') {
                        QVar75.m_data = local_118.d.ptr;
                        QVar75.m_size = 1;
                        QVar143.m_data = "I";
                        QVar143.m_size = 1;
                        cVar13 = QtPrivate::equalStrings(QVar75,QVar143);
                        if (cVar13 == '\0') goto LAB_0051ec3d;
                        this_02->listStyle = ListUpperRoman;
                      }
                      else {
                        this_02->listStyle = ListLowerRoman;
                      }
                    }
                    else {
                      this_02->listStyle = ListUpperAlpha;
                    }
                  }
                  else {
                    this_02->listStyle = ListLowerAlpha;
                  }
                }
                else {
                  this_02->listStyle = ListDecimal;
                }
              }
              else {
LAB_0051ec3d:
                QString::toLower_helper((QString *)&local_78);
                pDVar9 = local_118.d.d;
                pQVar11 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
                pQVar7 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
                local_78._0_4_ = SUB84(local_118.d.d,0);
                local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
                puVar23 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
                local_78._8_4_ = SUB84(local_118.d.ptr,0);
                local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
                local_78._16_4_ = (undefined4)local_118.d.size;
                local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
                local_118.d.ptr = (char16_t *)pQVar7;
                local_118.d.size = (qsizetype)puVar23;
                if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    local_118.d.d = (Data *)pQVar11;
                    QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
                    pQVar11 = &(local_118.d.d)->super_QArrayData;
                  }
                }
                local_118.d.d = (Data *)pQVar11;
                qVar20 = local_118.d.size;
                if (((undefined1 *)local_118.d.size == &DAT_00000006) &&
                   (QVar76.m_data = local_118.d.ptr, QVar76.m_size = 6, QVar144.m_data = "square",
                   QVar144.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar76,QVar144),
                   cVar13 != '\0')) {
                  this_02->listStyle = ListSquare;
                }
                else if (((undefined8 *)qVar20 == (undefined8 *)0x4) &&
                        (QVar77.m_data = local_118.d.ptr, QVar77.m_size = 4, QVar145.m_data = "disc"
                        , QVar145.m_size = 4, cVar13 = QtPrivate::equalStrings(QVar77,QVar145),
                        cVar13 != '\0')) {
                  this_02->listStyle = ListDisc;
                }
                else if (((undefined1 *)qVar20 == &DAT_00000006) &&
                        (QVar78.m_data = local_118.d.ptr, QVar78.m_size = 6,
                        QVar146.m_data = "circle", QVar146.m_size = 6,
                        cVar13 = QtPrivate::equalStrings(QVar78,QVar146), cVar13 != '\0')) {
                  this_02->listStyle = ListCircle;
                }
                else if (((undefined8 *)qVar20 == (undefined8 *)0x4) &&
                        (QVar79.m_data = local_118.d.ptr, QVar79.m_size = 4,
                        QVar147.m_data = anon_var_dwarf_3a8a04, QVar147.m_size = 4,
                        cVar13 = QtPrivate::equalStrings(QVar79,QVar147), cVar13 != '\0')) {
                  this_02->listStyle = ListStyleUndefined;
                }
              }
            }
            break;
          case Html_li:
            if ((lVar5 == 5) &&
               (QVar51.m_data = pcVar4, QVar51.m_size = 5, QVar119.m_data = "class",
               QVar119.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar51,QVar119), cVar13 != '\0')
               ) {
              if ((undefined8 *)local_118.d.size == (undefined8 *)0x7) {
                QVar72.m_data = local_118.d.ptr;
                QVar72.m_size = 7;
                QVar140.m_data = "checked";
                QVar140.m_size = 7;
                cVar13 = QtPrivate::equalStrings(QVar72,QVar140);
                if (cVar13 != '\0') {
                  iVar15 = 2;
                  goto LAB_0051e85e;
                }
              }
              else if (((undefined8 *)local_118.d.size == (undefined8 *)0x9) &&
                      (QVar52.m_data = local_118.d.ptr, QVar52.m_size = 9,
                      QVar120.m_data = "unchecked", QVar120.m_size = 9,
                      cVar13 = QtPrivate::equalStrings(QVar52,QVar120), cVar13 != '\0')) {
                iVar15 = 1;
LAB_0051e85e:
                ::QVariant::QVariant((QVariant *)&local_78,iVar15);
                QTextFormat::setProperty(&this_01->super_QTextFormat,0x10a0,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
              }
            }
            break;
          case Html_code:
          case Html_tt:
          case Html_kbd:
          case Html_samp:
          case Html_br:
          case Html_sub:
          case Html_sup:
            break;
          case Html_img:
            pQVar24 = &this_02->imageName;
            if (((lVar5 == 3) &&
                (QVar44.m_data = pcVar4, QVar44.m_size = 3, QVar114.m_data = "src",
                QVar114.m_size = 3, cVar13 = QtPrivate::equalStrings(QVar44,QVar114), cVar13 != '\0'
                )) || ((lVar5 == 6 &&
                       (QVar45.m_data = pcVar4, QVar45.m_size = 6, QVar115.m_data = "source",
                       QVar115.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar45,QVar115),
                       cVar13 != '\0')))) goto LAB_0051dc8f;
            if ((lVar5 == 5) &&
               (QVar55.m_data = pcVar4, QVar55.m_size = 5, QVar123.m_data = "width",
               QVar123.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar55,QVar123), cVar13 != '\0')
               ) {
              this_02->imageWidth = -2.0;
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              qVar29 = (qreal)QString::toDouble((bool *)&local_118);
              if (local_78.data[0] == '\x01') {
                this_02->imageWidth = qVar29;
              }
            }
            else if ((lVar5 == 6) &&
                    (QVar58.m_data = pcVar4, QVar58.m_size = 6, QVar126.m_data = "height",
                    QVar126.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar58,QVar126),
                    cVar13 != '\0')) {
              this_02->imageHeight = -2.0;
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              qVar29 = (qreal)QString::toDouble((bool *)&local_118);
              if (local_78.data[0] == '\x01') {
                this_02->imageHeight = qVar29;
              }
            }
            else if (((lVar5 == 3) &&
                     (QVar62.m_data = pcVar4, QVar62.m_size = 3, QVar130.m_data = "alt",
                     QVar130.m_size = 3, cVar13 = QtPrivate::equalStrings(QVar62,QVar130),
                     pQVar24 = &this_02->imageAlt, cVar13 != '\0')) ||
                    ((lVar5 == 5 &&
                     (QVar65.m_data = pcVar4, QVar65.m_size = 5, QVar133.m_data = "title",
                     QVar133.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar65,QVar133),
                     pQVar24 = &this_02->text, cVar13 != '\0')))) goto LAB_0051dc8f;
            break;
          case Html_hr:
            if (lVar5 == 5) {
              QVar50.m_data = pcVar4;
              QVar50.m_size = 5;
              QVar118.m_data = "width";
              QVar118.m_size = 5;
              cVar13 = QtPrivate::equalStrings(QVar50,QVar118);
joined_r0x0051e7cf:
              if (cVar13 != '\0') goto LAB_0051de42;
            }
            break;
          case Html_pre:
            if (((lVar5 == 5) &&
                (QVar46.m_data = pcVar4, QVar46.m_size = 5, QVar116.m_data = "class",
                QVar116.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar46,QVar116), cVar13 != '\0'
                )) && (QVar47.m_data = (char *)0x9, QVar47.m_size = (qsizetype)&local_118,
                      cVar13 = QString::startsWith(QVar47,0x6bf953), cVar13 != '\0')) {
              QString::mid((longlong)&local_b8,(longlong)&local_118);
              ::QVariant::QVariant((QVariant *)&local_78,(QString *)&local_b8);
              QTextFormat::setProperty(&this_01->super_QTextFormat,0x1090,(QVariant *)&local_78);
              ::QVariant::~QVariant((QVariant *)&local_78);
              if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                LOCK();
                *(int *)local_b8.super_QStringTokenizerBaseBase =
                     *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                UNLOCK();
                if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,2,0x10);
                }
              }
            }
            break;
          default:
            if (QVar2 == Html_body) goto switchD_0051d8c2_caseD_2e;
            if ((QVar2 == Html_a) && (lVar5 == 4)) {
              QVar36.m_data = pcVar4;
              QVar36.m_size = 4;
              QVar106.m_data = "href";
              QVar106.m_size = 4;
              cVar13 = QtPrivate::equalStrings(QVar36,QVar106);
              if (cVar13 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_78,&local_118);
                iVar15 = 0x2031;
                goto LAB_0051ddf7;
              }
              QVar66.m_data = pcVar4;
              QVar66.m_size = 4;
              QVar134.m_data = "name";
              QVar134.m_size = 4;
              cVar13 = QtPrivate::equalStrings(QVar66,QVar134);
              qVar20 = local_118.d.size;
              pcVar10 = local_118.d.ptr;
              pDVar9 = local_118.d.d;
              if (cVar13 != '\0') {
                if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                }
                local_78._0_4_ = 0xaaaaaaaa;
                local_78._4_4_ = 0xaaaaaaaa;
                local_b8.m_haystack.m_size =
                     QArrayData::allocate((QArrayData **)&local_78.shared,0x18,0x10,1,KeepSize);
                local_b8.super_QStringTokenizerBaseBase.m_cs = local_78._4_4_;
                local_b8.super_QStringTokenizerBaseBase.m_sb.
                super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                     (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                     (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)local_78._0_4_;
                *(Data **)local_b8.m_haystack.m_size = pDVar9;
                *(char16_t **)(local_b8.m_haystack.m_size + 8) = pcVar10;
                *(qsizetype *)(local_b8.m_haystack.m_size + 0x10) = qVar20;
                if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)&local_b8);
                if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
                  }
                }
              }
            }
          }
        }
        else {
          switch(QVar2) {
          case Html_table:
            if ((((lVar5 != 6) ||
                 (QVar39.m_data = pcVar4, QVar39.m_size = 6, QVar109.m_data = "border",
                 QVar109.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar39,QVar109),
                 cVar13 == '\0')) || (this_02->tableBorder != 0.0)) || (NAN(this_02->tableBorder)))
            {
              if ((lVar5 == 7) &&
                 (QVar53.m_data = pcVar4, QVar53.m_size = 7, QVar121.m_data = "bgcolor",
                 QVar121.m_size = 7, cVar13 = QtPrivate::equalStrings(QVar53,QVar121),
                 sVar22 = extraout_RDX_01, cVar13 != '\0')) {
LAB_0051def6:
                local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                name_00.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
                name_00.m_size = sVar22;
                QVar98 = QColor::fromString((QColor *)local_118.d.ptr,name_00);
                local_98.d = QVar98._0_8_;
                local_98.ptr._0_6_ = QVar98.ct._4_6_;
                if (QVar98.cspec == Invalid) {
                  local_78._0_4_ = 2;
                  local_78._4_4_ = 0;
                  local_78._8_4_ = 0;
                  local_78._12_4_ = 0;
                  local_78._16_4_ = 0;
                  local_78._20_4_ = 0;
                  pcStack_60 = "default";
                  QString::toLatin1_helper((QString *)&local_b8);
                  puVar23 = (undefined8 *)local_b8.m_haystack.m_size;
                  if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                    puVar23 = &QByteArray::_empty;
                  }
                  QMessageLogger::warning
                            ((char *)local_78.data,
                             "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar23);
                  if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_b8.super_QStringTokenizerBaseBase =
                         *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                    UNLOCK();
                    if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                    }
                  }
                }
                QBrush::QBrush((QBrush *)&local_b8,(QColor *)&local_98,SolidPattern);
                QBrush::operator_cast_to_QVariant((QVariant *)&local_78,(QBrush *)&local_b8);
                QTextFormat::setProperty(&this_00->super_QTextFormat,0x820,(QVariant *)&local_78);
                ::QVariant::~QVariant((QVariant *)&local_78);
                QBrush::~QBrush((QBrush *)&local_b8);
              }
              else if ((lVar5 == 0xb) &&
                      (QVar54.m_data = pcVar4, QVar54.m_size = 0xb, QVar122.m_data = "bordercolor",
                      QVar122.m_size = 0xb, cVar13 = QtPrivate::equalStrings(QVar54,QVar122),
                      cVar13 != '\0')) {
                name_01.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
                name_01.m_size = extraout_RDX_02;
                QVar98 = QColor::fromString((QColor *)local_118.d.ptr,name_01);
                if (QVar98.cspec == Invalid) {
                  local_78._0_4_ = 2;
                  local_78._4_4_ = 0;
                  local_78._8_4_ = 0;
                  local_78._12_4_ = 0;
                  local_78._16_4_ = 0;
                  local_78._20_4_ = 0;
                  pcStack_60 = "default";
                  QString::toLatin1_helper((QString *)&local_b8);
                  puVar23 = (undefined8 *)local_b8.m_haystack.m_size;
                  if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                    puVar23 = &QByteArray::_empty;
                  }
                  QMessageLogger::warning
                            ((char *)local_78.data,
                             "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar23);
                  if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_b8.super_QStringTokenizerBaseBase =
                         *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                    UNLOCK();
                    if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                    }
                  }
                }
                color._8_8_ = QVar98._8_8_ & 0xffffffffffff | 0xaaaa000000000000;
                color._0_8_ = QVar98._0_8_;
                QBrush::operator=(&this_02->borderBrush,color);
              }
              else {
                if ((lVar5 == 10) &&
                   (QVar56.m_data = pcVar4, QVar56.m_size = 10, QVar124.m_data = "background",
                   QVar124.m_size = 10, cVar13 = QtPrivate::equalStrings(QVar56,QVar124),
                   cVar13 != '\0')) goto LAB_0051e513;
                if (lVar5 == 0xb) {
                  QVar57.m_data = pcVar4;
                  QVar57.m_size = 0xb;
                  QVar125.m_data = "cellspacing";
                  QVar125.m_size = 0xb;
                  cVar13 = QtPrivate::equalStrings(QVar57,QVar125);
                  if (cVar13 == '\0') {
                    QVar68.m_data = pcVar4;
                    QVar68.m_size = 0xb;
                    QVar136.m_data = "cellpadding";
                    QVar136.m_size = 0xb;
                    cVar13 = QtPrivate::equalStrings(QVar68,QVar136);
                    if (cVar13 == '\0') goto LAB_0051e787;
                    local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                    qVar29 = (qreal)QString::toDouble((bool *)&local_118);
                    if (local_78.data[0] == '\x01') {
                      this_02->tableCellPadding = qVar29;
                    }
                  }
                  else {
                    local_78._0_4_ = local_78._0_4_ & 0xffffff00;
                    qVar29 = (qreal)QString::toDouble((bool *)&local_118);
                    if (local_78.data[0] == '\x01') {
                      this_02->tableCellSpacing = qVar29;
                    }
                  }
                }
                else {
LAB_0051e787:
                  if ((lVar5 == 5) &&
                     (QVar69.m_data = pcVar4, QVar69.m_size = 5, QVar137.m_data = "width",
                     QVar137.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar69,QVar137),
                     cVar13 != '\0')) goto LAB_0051de42;
                  if (lVar5 == 6) {
                    QVar70.m_data = pcVar4;
                    QVar70.m_size = 6;
                    QVar138.m_data = "height";
                    QVar138.m_size = 6;
                    cVar13 = QtPrivate::equalStrings(QVar70,QVar138);
                    pQVar25 = &this_02->height;
                    goto joined_r0x0051e7cf;
                  }
                }
              }
            }
            else {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              qVar29 = (qreal)QString::toDouble((bool *)&local_118);
              if (local_78.data[0] == '\x01') {
                this_02->tableBorder = qVar29;
              }
            }
            break;
          case Html_tr:
switchD_0051d8c2_caseD_2e:
            if (lVar5 == 10) {
              QVar63.m_data = pcVar4;
              QVar63.m_size = 10;
              QVar131.m_data = "background";
              QVar131.m_size = 10;
              cVar13 = QtPrivate::equalStrings(QVar63,QVar131);
              if (cVar13 != '\0') {
LAB_0051e513:
                QTextHtmlParserNode::applyBackgroundImage(this_02,&local_118,this->resourceProvider)
                ;
              }
            }
            else if ((lVar5 == 7) &&
                    (QVar37.m_data = pcVar4, QVar37.m_size = 7, QVar107.m_data = "bgcolor",
                    QVar107.m_size = 7, cVar13 = QtPrivate::equalStrings(QVar37,QVar107),
                    cVar13 != '\0')) {
              local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
              name.field_0.m_data = (void *)(local_118.d.size | 0x8000000000000000);
              name.m_size = extraout_RDX_00;
              QVar98 = QColor::fromString((QColor *)local_118.d.ptr,name);
              local_98.d = QVar98._0_8_;
              local_98.ptr._0_6_ = QVar98.ct._4_6_;
              if (QVar98.cspec == Invalid) {
                local_78._0_4_ = 2;
                local_78._4_4_ = 0;
                local_78._8_4_ = 0;
                local_78._12_4_ = 0;
                local_78._16_4_ = 0;
                local_78._20_4_ = 0;
                pcStack_60 = "default";
                QString::toLatin1_helper((QString *)&local_b8);
                puVar23 = (undefined8 *)local_b8.m_haystack.m_size;
                if ((undefined8 *)local_b8.m_haystack.m_size == (undefined8 *)0x0) {
                  puVar23 = &QByteArray::_empty;
                }
                QMessageLogger::warning
                          ((char *)local_78.data,
                           "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",puVar23);
                if (local_b8.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_b8.super_QStringTokenizerBaseBase =
                       *(int *)local_b8.super_QStringTokenizerBaseBase + -1;
                  UNLOCK();
                  if (*(int *)local_b8.super_QStringTokenizerBaseBase == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)local_b8.super_QStringTokenizerBaseBase,1,0x10);
                  }
                }
              }
              QBrush::QBrush((QBrush *)&local_b8,(QColor *)&local_98,SolidPattern);
              QBrush::operator_cast_to_QVariant((QVariant *)&local_78,(QBrush *)&local_b8);
              iVar15 = 0x820;
              goto LAB_0051e452;
            }
            break;
          case Html_td:
          case Html_th:
            if ((lVar5 == 5) &&
               (QVar32.m_data = pcVar4, QVar32.m_size = 5, QVar102.m_data = "width",
               QVar102.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar32,QVar102), cVar13 != '\0')
               ) {
LAB_0051de42:
              setWidthAttribute(pQVar25,&local_118);
            }
            else {
              if ((lVar5 == 7) &&
                 (QVar33.m_data = pcVar4, QVar33.m_size = 7, QVar103.m_data = "bgcolor",
                 QVar103.m_size = 7, cVar13 = QtPrivate::equalStrings(QVar33,QVar103),
                 sVar22 = extraout_RDX, cVar13 != '\0')) goto LAB_0051def6;
              if ((lVar5 == 10) &&
                 (QVar34.m_data = pcVar4, QVar34.m_size = 10, QVar104.m_data = "background",
                 QVar104.m_size = 10, cVar13 = QtPrivate::equalStrings(QVar34,QVar104),
                 cVar13 != '\0')) goto LAB_0051e513;
              if (lVar5 == 7) {
                QVar35.m_data = pcVar4;
                QVar35.m_size = 7;
                QVar105.m_data = "rowspan";
                QVar105.m_size = 7;
                cVar13 = QtPrivate::equalStrings(QVar35,QVar105);
                if (cVar13 == '\0') {
                  QVar67.m_data = pcVar4;
                  QVar67.m_size = 7;
                  QVar135.m_data = "colspan";
                  QVar135.m_size = 7;
                  cVar13 = QtPrivate::equalStrings(QVar67,QVar135);
                  if ((cVar13 != '\0') && (bVar12 = setIntAttribute(destination,&local_118), bVar12)
                     ) {
                    iVar15 = *destination;
                    piVar27 = destination;
                    if (0x4fff < iVar15) {
                      iVar15 = 0x5000;
                    }
LAB_0051d979:
                    if (iVar15 < 2) {
                      iVar15 = 1;
                    }
                    *piVar27 = iVar15;
                  }
                }
                else {
                  bVar12 = setIntAttribute(destination_00,&local_118);
                  if (bVar12) {
                    iVar15 = *destination_00;
                    piVar27 = destination_00;
                    goto LAB_0051d979;
                  }
                }
              }
            }
            break;
          case Html_meta:
            if ((((lVar5 == 4) &&
                 (QVar40.m_data = pcVar4, QVar40.m_size = 4, QVar110.m_data = "name",
                 QVar110.m_size = 4, cVar13 = QtPrivate::equalStrings(QVar40,QVar110),
                 cVar13 != '\0')) && ((undefined8 *)local_118.d.size == (undefined8 *)0x9)) &&
               (QVar41.m_data = local_118.d.ptr, QVar41.m_size = 9, QVar111.m_data = "qrichtext",
               QVar111.m_size = 9, cVar13 = QtPrivate::equalStrings(QVar41,QVar111), cVar13 != '\0')
               ) {
              bVar21 = true;
            }
            if (((lVar5 == 7) &&
                (QVar42.m_data = pcVar4, QVar42.m_size = 7, QVar112.m_data = "content",
                QVar112.m_size = 7, cVar13 = QtPrivate::equalStrings(QVar42,QVar112), cVar13 != '\0'
                )) && (((undefined8 *)local_118.d.size == (undefined8 *)0x1 &&
                       ((QVar43.m_data = local_118.d.ptr, QVar43.m_size = 1, QVar113.m_data = "1",
                        QVar113.m_size = 1, cVar13 = QtPrivate::equalStrings(QVar43,QVar113),
                        cVar13 != '\0' && (bVar21)))))) {
              this->textEditMode = true;
            }
            break;
          case Html_link:
            if (lVar5 == 4) {
              QVar38.m_data = pcVar4;
              QVar38.m_size = 4;
              QVar108.m_data = "href";
              QVar108.m_size = 4;
              cVar13 = QtPrivate::equalStrings(QVar38,QVar108);
              if (cVar13 == '\0') {
                QVar64.m_data = pcVar4;
                QVar64.m_size = 4;
                QVar132.m_data = "type";
                QVar132.m_size = 4;
                cVar13 = QtPrivate::equalStrings(QVar64,QVar132);
                if (cVar13 == '\0') break;
                pQVar24 = &local_f8;
              }
              else {
                pQVar24 = &local_d8;
              }
LAB_0051dc8f:
              QString::operator=(pQVar24,&local_118);
            }
          }
        }
        pQVar26 = &this_00->super_QTextFormat;
        if (lVar5 == 5) {
          QVar80.m_data = pcVar4;
          QVar80.m_size = 5;
          QVar148.m_data = "style";
          QVar148.m_size = 5;
          cVar13 = QtPrivate::equalStrings(QVar80,QVar148);
          if (cVar13 != '\0') {
            QTextHtmlParserNode::parseStyleAttribute(this_02,&local_118,this->resourceProvider);
            goto LAB_0051f2bc;
          }
          QVar81.m_data = pcVar4;
          QVar81.m_size = 5;
          QVar149.m_data = "align";
          QVar149.m_size = 5;
          cVar13 = QtPrivate::equalStrings(QVar81,QVar149);
          if (cVar13 == '\0') goto LAB_0051eed4;
          QString::toLower_helper((QString *)&local_78);
          pDVar9 = local_118.d.d;
          pQVar11 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
          pQVar7 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
          local_78._0_4_ = SUB84(local_118.d.d,0);
          local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
          puVar23 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
          local_78._8_4_ = SUB84(local_118.d.ptr,0);
          local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
          local_78._16_4_ = (undefined4)local_118.d.size;
          local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
          local_118.d.ptr = (char16_t *)pQVar7;
          local_118.d.size = (qsizetype)puVar23;
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              local_118.d.d = (Data *)pQVar11;
              QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
              pQVar11 = &(local_118.d.d)->super_QArrayData;
            }
          }
          local_118.d.d = (Data *)pQVar11;
          qVar20 = local_118.d.size;
          switch(local_118.d.size) {
          case 4:
            QVar82.m_data = local_118.d.ptr;
            QVar82.m_size = local_118.d.size;
            QVar150.m_data = "left";
            QVar150.m_size = 4;
            cVar13 = QtPrivate::equalStrings(QVar82,QVar150);
            if (cVar13 != '\0') {
              iVar15 = 0x11;
              goto LAB_0051f437;
            }
            if ((undefined8 *)qVar20 == (undefined8 *)0x7) goto switchD_0051eea0_caseD_7;
            if ((undefined1 *)qVar20 == &DAT_00000006) goto switchD_0051eea0_caseD_6;
            if ((undefined1 *)qVar20 == &DAT_00000005) goto switchD_0051eea0_caseD_5;
            break;
          case 5:
switchD_0051eea0_caseD_5:
            QVar92.m_data = local_118.d.ptr;
            QVar92.m_size = qVar20;
            QVar160.m_data = "right";
            QVar160.m_size = 5;
            cVar13 = QtPrivate::equalStrings(QVar92,QVar160);
            if (cVar13 != '\0') {
              iVar15 = 0x12;
              goto LAB_0051f437;
            }
            if ((undefined8 *)qVar20 == (undefined8 *)0x7) goto switchD_0051eea0_caseD_7;
            if ((undefined1 *)qVar20 == &DAT_00000006) goto switchD_0051eea0_caseD_6;
            break;
          case 6:
switchD_0051eea0_caseD_6:
            QVar93.m_data = local_118.d.ptr;
            QVar93.m_size = qVar20;
            QVar161.m_data = "center";
            QVar161.m_size = 6;
            cVar13 = QtPrivate::equalStrings(QVar93,QVar161);
            if (cVar13 != '\0') {
              iVar15 = 4;
              goto LAB_0051f437;
            }
            if ((undefined8 *)qVar20 == (undefined8 *)0x7) goto switchD_0051eea0_caseD_7;
            break;
          case 7:
switchD_0051eea0_caseD_7:
            QVar94.m_data = local_118.d.ptr;
            QVar94.m_size = qVar20;
            QVar162.m_data = "justify";
            QVar162.m_size = 7;
            cVar13 = QtPrivate::equalStrings(QVar94,QVar162);
            if (cVar13 == '\0') break;
            iVar15 = 8;
LAB_0051f437:
            ::QVariant::QVariant((QVariant *)&local_78,iVar15);
            QTextFormat::setProperty(&this_01->super_QTextFormat,0x1010,(QVariant *)&local_78);
            ::QVariant::~QVariant((QVariant *)&local_78);
            bVar12 = true;
            goto LAB_0051f45c;
          }
          bVar12 = false;
LAB_0051f45c:
          if (this_02->id == Html_img) {
            if (bVar12) {
              iVar15 = QTextFormat::intProperty(&this_01->super_QTextFormat,0x1010);
              if ((iVar15 + (uint)(iVar15 == 0) & 1) == 0) {
                uVar16 = QTextFormat::intProperty(&this_01->super_QTextFormat,0x1010);
                if ((uVar16 & 2) == 0) goto LAB_0051f2bc;
                uVar14 = (ushort)*(undefined4 *)&this_02->field_0x90 & 0xfffc | 2;
              }
              else {
                uVar14 = ((ushort)*(undefined4 *)&this_02->field_0x90 & 0xfffc) + 1;
              }
              *(ushort *)&this_02->field_0x90 = uVar14;
            }
            else if ((undefined8 *)local_118.d.size == (undefined8 *)0x3) {
              QVar96.m_data = local_118.d.ptr;
              QVar96.m_size = 3;
              QVar164.m_data = "top";
              QVar164.m_size = 3;
              cVar13 = QtPrivate::equalStrings(QVar96,QVar164);
              if (cVar13 != '\0') {
                iVar15 = 4;
                goto LAB_0051f29d;
              }
            }
            else if (((undefined1 *)local_118.d.size == &DAT_00000006) &&
                    (QVar95.m_data = local_118.d.ptr, QVar95.m_size = 6, QVar163.m_data = "middle",
                    QVar163.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar95,QVar163),
                    cVar13 != '\0')) {
LAB_0051f28d:
              iVar15 = 3;
LAB_0051f29d:
              ::QVariant::QVariant((QVariant *)&local_78,iVar15);
              iVar15 = 0x2021;
              goto LAB_0051f2ac;
            }
          }
        }
        else {
LAB_0051eed4:
          if (lVar5 == 3) {
            QVar85.m_data = pcVar4;
            QVar85.m_size = 3;
            QVar153.m_data = "dir";
            QVar153.m_size = 3;
            cVar13 = QtPrivate::equalStrings(QVar85,QVar153);
            if (cVar13 == '\0') goto LAB_0051f0cd;
            QString::toLower_helper((QString *)&local_78);
            pDVar9 = local_118.d.d;
            pQVar11 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
            pQVar7 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
            local_78._0_4_ = SUB84(local_118.d.d,0);
            local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            puVar23 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
            local_78._8_4_ = SUB84(local_118.d.ptr,0);
            local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_78._16_4_ = (undefined4)local_118.d.size;
            local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = (char16_t *)pQVar7;
            local_118.d.size = (qsizetype)puVar23;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar11;
                QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
                pQVar11 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar11;
            if ((undefined8 *)local_118.d.size == (undefined8 *)0x3) {
              QVar86.m_data = local_118.d.ptr;
              QVar86.m_size = 3;
              QVar154.m_data = "ltr";
              QVar154.m_size = 3;
              cVar13 = QtPrivate::equalStrings(QVar86,QVar154);
              if (cVar13 == '\0') {
                QVar90.m_data = local_118.d.ptr;
                QVar90.m_size = 3;
                QVar158.m_data = "rtl";
                QVar158.m_size = 3;
                cVar13 = QtPrivate::equalStrings(QVar90,QVar158);
                if (cVar13 == '\0') goto LAB_0051f2bc;
                iVar15 = 1;
              }
              else {
                iVar15 = 0;
              }
              ::QVariant::QVariant((QVariant *)&local_78,iVar15);
              iVar15 = 0x801;
              pQVar26 = &this_01->super_QTextFormat;
              goto LAB_0051f2ac;
            }
          }
          else {
            if ((lVar5 == 6) &&
               (QVar83.m_data = pcVar4, QVar83.m_size = 6, QVar151.m_data = "valign",
               QVar151.m_size = 6, cVar13 = QtPrivate::equalStrings(QVar83,QVar151), cVar13 != '\0')
               ) {
              QString::toLower_helper((QString *)&local_78);
              pDVar9 = local_118.d.d;
              pQVar11 = (QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_);
              pQVar7 = (QColor *)CONCAT44(local_78._12_4_,local_78._8_4_);
              local_78._0_4_ = SUB84(local_118.d.d,0);
              local_78._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
              puVar23 = (undefined8 *)CONCAT44(local_78._20_4_,local_78._16_4_);
              local_78._8_4_ = SUB84(local_118.d.ptr,0);
              local_78._12_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
              local_78._16_4_ = (undefined4)local_118.d.size;
              local_78._20_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
              local_118.d.ptr = (char16_t *)pQVar7;
              local_118.d.size = (qsizetype)puVar23;
              if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  local_118.d.d = (Data *)pQVar11;
                  QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
                  pQVar11 = &(local_118.d.d)->super_QArrayData;
                }
              }
              local_118.d.d = (Data *)pQVar11;
              qVar20 = local_118.d.size;
              if (((undefined8 *)local_118.d.size != (undefined8 *)0x3) ||
                 (QVar84.m_data = local_118.d.ptr, QVar84.m_size = 3, QVar152.m_data = "top",
                 QVar152.m_size = 3, cVar13 = QtPrivate::equalStrings(QVar84,QVar152),
                 cVar13 == '\0')) {
                if ((undefined1 *)qVar20 != &DAT_00000006) goto LAB_0051f2bc;
                QVar89.m_data = local_118.d.ptr;
                QVar89.m_size = 6;
                QVar157.m_data = "middle";
                QVar157.m_size = 6;
                cVar13 = QtPrivate::equalStrings(QVar89,QVar157);
                if (cVar13 != '\0') goto LAB_0051f28d;
                QVar91.m_data = local_118.d.ptr;
                QVar91.m_size = 6;
                QVar159.m_data = "bottom";
                QVar159.m_size = 6;
                cVar13 = QtPrivate::equalStrings(QVar91,QVar159);
                if (cVar13 == '\0') goto LAB_0051f2bc;
                iVar15 = 5;
                goto LAB_0051f29d;
              }
              ::QVariant::QVariant((QVariant *)&local_78,4);
              QTextFormat::setProperty(&this_00->super_QTextFormat,0x2021,(QVariant *)&local_78);
            }
            else {
LAB_0051f0cd:
              if ((lVar5 != 5) ||
                 (QVar87.m_data = pcVar4, QVar87.m_size = 5, QVar155.m_data = "title",
                 QVar155.m_size = 5, cVar13 = QtPrivate::equalStrings(QVar87,QVar155),
                 cVar13 == '\0')) {
                if ((lVar5 == 2) &&
                   (QVar88.m_data = pcVar4, QVar88.m_size = 2, QVar156.m_data = "id",
                   QVar156.m_size = 2, cVar13 = QtPrivate::equalStrings(QVar88,QVar156),
                   cVar13 != '\0')) {
                  ::QVariant::QVariant((QVariant *)&local_78,true);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x2030,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  qVar20 = local_118.d.size;
                  pcVar4 = local_118.d.ptr;
                  pDVar9 = local_118.d.d;
                  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_118.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  local_78._0_4_ = 0xaaaaaaaa;
                  local_78._4_4_ = 0xaaaaaaaa;
                  local_b8.m_haystack.m_size =
                       QArrayData::allocate((QArrayData **)&local_78.shared,0x18,0x10,1,KeepSize);
                  local_b8.super_QStringTokenizerBaseBase.m_cs = local_78._4_4_;
                  local_b8.super_QStringTokenizerBaseBase.m_sb.
                  super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)local_78._0_4_;
                  *(Data **)local_b8.m_haystack.m_size = pDVar9;
                  *(char16_t **)(local_b8.m_haystack.m_size + 8) = pcVar4;
                  *(qsizetype *)(local_b8.m_haystack.m_size + 0x10) = qVar20;
                  if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  local_b8.m_haystack.m_data = (storage_type_conflict *)0x1;
                  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
                  QTextFormat::setProperty(&this_00->super_QTextFormat,0x2032,(QVariant *)&local_78)
                  ;
                  ::QVariant::~QVariant((QVariant *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                  if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
                    }
                  }
                }
                goto LAB_0051f2bc;
              }
              ::QVariant::QVariant((QVariant *)&local_78,&local_118);
              iVar15 = 0x2024;
LAB_0051f2ac:
              QTextFormat::setProperty(pQVar26,iVar15,(QVariant *)&local_78);
            }
            ::QVariant::~QVariant((QVariant *)&local_78);
          }
        }
LAB_0051f2bc:
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
        uVar28 = uVar28 + 2;
      } while (uVar28 < (ulong)(attributes->d).size);
    }
    if ((((this->resourceProvider != (QTextDocument *)0x0) && (local_d8.d.size != 0)) &&
        (local_f8.d.size == 8)) &&
       (QVar97.m_data = local_f8.d.ptr, QVar97.m_size = 8, QVar165.m_data = "text/css",
       QVar165.m_size = 8, cVar13 = QtPrivate::equalStrings(QVar97,QVar165), cVar13 != '\0')) {
      importStyleSheet(this,&local_d8);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::applyAttributes(const QStringList &attributes)
{
    // local state variable for qt3 textedit mode
    bool seenQt3Richtext = false;
    QString linkHref;
    QString linkType;

    if (attributes.size() % 2 == 1)
        return;

    QTextHtmlParserNode *node = nodes.last();

    for (int i = 0; i < attributes.size(); i += 2) {
        QString key = attributes.at(i);
        QString value = attributes.at(i + 1);

        switch (node->id) {
            case Html_font:
                // the infamous font tag
                if (key == "size"_L1 && value.size()) {
                    int n = value.toInt();
                    if (value.at(0) != u'+' && value.at(0) != u'-')
                        n -= 3;
                    node->charFormat.setProperty(QTextFormat::FontSizeAdjustment, n);
                } else if (key == "face"_L1) {
                    if (value.contains(u',')) {
                        QStringList families;
                        for (auto family : value.tokenize(u','))
                            families << family.trimmed().toString();
                        node->charFormat.setFontFamilies(families);
                    } else {
                        node->charFormat.setFontFamilies(QStringList(value));
                    }
                } else if (key == "color"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setForeground(c);
                }
                break;
            case Html_ol:
            case Html_ul:
                if (key == "type"_L1) {
                    node->hasOwnListStyle = true;
                    if (value == "1"_L1) {
                        node->listStyle = QTextListFormat::ListDecimal;
                    } else if (value == "a"_L1) {
                        node->listStyle = QTextListFormat::ListLowerAlpha;
                    } else if (value == "A"_L1) {
                        node->listStyle = QTextListFormat::ListUpperAlpha;
                    } else if (value == "i"_L1) {
                        node->listStyle = QTextListFormat::ListLowerRoman;
                    } else if (value == "I"_L1) {
                        node->listStyle = QTextListFormat::ListUpperRoman;
                    } else {
                        value = std::move(value).toLower();
                        if (value == "square"_L1)
                            node->listStyle = QTextListFormat::ListSquare;
                        else if (value == "disc"_L1)
                            node->listStyle = QTextListFormat::ListDisc;
                        else if (value == "circle"_L1)
                            node->listStyle = QTextListFormat::ListCircle;
                        else if (value == "none"_L1)
                            node->listStyle = QTextListFormat::ListStyleUndefined;
                    }
                } else if (key == "start"_L1) {
                    setIntAttribute(&node->listStart, value);
                }
                break;
            case Html_li:
                if (key == "class"_L1) {
                    if (value == "unchecked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Unchecked);
                    else if (value == "checked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Checked);
                }
                break;
            case Html_a:
                if (key == "href"_L1)
                    node->charFormat.setAnchorHref(value);
                else if (key == "name"_L1)
                    node->charFormat.setAnchorNames({value});
                break;
            case Html_img:
                if (key == "src"_L1 || key == "source"_L1) {
                    node->imageName = value;
                } else if (key == "width"_L1) {
                    node->imageWidth = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageWidth, value);
                } else if (key == "height"_L1) {
                    node->imageHeight = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageHeight, value);
                } else if (key == "alt"_L1) {
                    node->imageAlt = value;
                } else if (key == "title"_L1) {
                    node->text = value;
                }
                break;
            case Html_tr:
            case Html_body:
                if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                }
                break;
            case Html_th:
            case Html_td:
                if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "rowspan"_L1) {
                    if (setIntAttribute(&node->tableCellRowSpan, value))
                        node->tableCellRowSpan = qMax(1, node->tableCellRowSpan);
                } else if (key == "colspan"_L1) {
                    if (setIntAttribute(&node->tableCellColSpan, value))
                        node->tableCellColSpan = qBound(1, node->tableCellColSpan, 20480);
                }
                break;
            case Html_table:
                // If table border already set through css style, prefer that one otherwise consider this value
                if (key == "border"_L1 && !node->tableBorder) {
                    setFloatAttribute(&node->tableBorder, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "bordercolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->borderBrush = c;
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "cellspacing"_L1) {
                    setFloatAttribute(&node->tableCellSpacing, value);
                } else if (key == "cellpadding"_L1) {
                    setFloatAttribute(&node->tableCellPadding, value);
                } else if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "height"_L1) {
                    setWidthAttribute(&node->height, value);
                }
                break;
            case Html_meta:
                if (key == "name"_L1 && value == "qrichtext"_L1)
                    seenQt3Richtext = true;

                if (key == "content"_L1 && value == "1"_L1 && seenQt3Richtext)
                    textEditMode = true;
                break;
            case Html_hr:
                if (key == "width"_L1)
                    setWidthAttribute(&node->width, value);
                break;
            case Html_link:
                if (key == "href"_L1)
                    linkHref = value;
                else if (key == "type"_L1)
                    linkType = value;
                break;
            case Html_pre:
                if (key == "class"_L1 && value.startsWith("language-"_L1))
                    node->blockFormat.setProperty(QTextFormat::BlockCodeLanguage, value.mid(9));
                break;
            default:
                break;
        }

        if (key == "style"_L1) {
#ifndef QT_NO_CSSPARSER
            node->parseStyleAttribute(value, resourceProvider);
#endif
        } else if (key == "align"_L1) {
            value = std::move(value).toLower();
            bool alignmentSet = true;

            if (value == "left"_L1)
                node->blockFormat.setAlignment(Qt::AlignLeft|Qt::AlignAbsolute);
            else if (value == "right"_L1)
                node->blockFormat.setAlignment(Qt::AlignRight|Qt::AlignAbsolute);
            else if (value == "center"_L1)
                node->blockFormat.setAlignment(Qt::AlignHCenter);
            else if (value == "justify"_L1)
                node->blockFormat.setAlignment(Qt::AlignJustify);
            else
                alignmentSet = false;

            if (node->id == Html_img) {
                // HTML4 compat
                if (alignmentSet) {
                    if (node->blockFormat.alignment() & Qt::AlignLeft)
                        node->cssFloat = QTextFrameFormat::FloatLeft;
                    else if (node->blockFormat.alignment() & Qt::AlignRight)
                        node->cssFloat = QTextFrameFormat::FloatRight;
                } else if (value == "middle"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
                } else if (value == "top"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
                }
            }
        } else if (key == "valign"_L1) {
            value = std::move(value).toLower();
            if (value == "top"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
            else if (value == "middle"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
            else if (value == "bottom"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom);
        } else if (key == "dir"_L1) {
            value = std::move(value).toLower();
            if (value == "ltr"_L1)
                node->blockFormat.setLayoutDirection(Qt::LeftToRight);
            else if (value == "rtl"_L1)
                node->blockFormat.setLayoutDirection(Qt::RightToLeft);
        } else if (key == "title"_L1) {
            node->charFormat.setToolTip(value);
        } else if (key == "id"_L1) {
            node->charFormat.setAnchor(true);
            node->charFormat.setAnchorNames({value});
        }
    }

#ifndef QT_NO_CSSPARSER
    if (resourceProvider && !linkHref.isEmpty() && linkType == "text/css"_L1)
        importStyleSheet(linkHref);
#endif
}